

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O2

int __thiscall Algorithms::jacobiSymbol(Algorithms *this,BigInteger *a,BigInteger *P)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  BigInteger *this_00;
  vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_> fact;
  BigInteger p;
  BigInteger local_90;
  BigInteger local_70;
  BigInteger local_50;
  
  BigIntegerLibrary::BigInteger::BigInteger(&p,1);
  bVar1 = BigIntegerLibrary::BigInteger::operator==(P,&p);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&p);
  if (bVar1) {
    iVar3 = 1;
  }
  else {
    BigIntegerLibrary::BigInteger::BigInteger(&local_90,P);
    factorization(&fact,this,&local_90);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
    std::
    __sort<__gnu_cxx::__normal_iterator<BigIntegerLibrary::BigInteger*,std::vector<BigIntegerLibrary::BigInteger,std::allocator<BigIntegerLibrary::BigInteger>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (fact.
               super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
               ._M_impl.super__Vector_impl_data._M_start,
               fact.
               super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    iVar3 = 1;
    for (; fact.
           super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           fact.
           super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        fact.
        super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
        ._M_impl.super__Vector_impl_data._M_start =
             fact.
             super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      BigIntegerLibrary::BigInteger::BigInteger
                (&p,fact.
                    super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                    ._M_impl.super__Vector_impl_data._M_start);
      BigIntegerLibrary::BigInteger::BigInteger(&local_50,a);
      this_00 = &local_70;
      BigIntegerLibrary::BigInteger::BigInteger(&local_70,&p);
      iVar2 = legendreSymbol((Algorithms *)this_00,&local_50,&local_70);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_50);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&p);
      if (iVar2 == 0) {
        iVar3 = 0;
        break;
      }
      iVar3 = iVar3 * iVar2;
    }
    std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>::
    ~vector(&fact);
  }
  return iVar3;
}

Assistant:

int Algorithms::jacobiSymbol(BigInteger a, BigInteger P) {
    if (P == BigInteger(1)) {
        return 1;
    }
    auto fact = factorization(P);
    sort(fact.begin(), fact.end());
    int ans = 1;
    for (BigInteger p: fact) {
        ans *= legendreSymbol(a, p);
        if (ans == 0) {
            return 0;
        }
    }
    return ans;
}